

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtlp.c
# Opt level: O3

ssize_t dma_write(nettlp *nt,uintptr_t addr,void *buf,size_t count)

{
  ulong uVar1;
  uint uVar2;
  ssize_t sVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  byte bVar7;
  ushort uVar8;
  uint uVar9;
  ulong uVar10;
  byte bVar11;
  bool bVar12;
  uint64_t dst_addr64;
  char pad [4];
  nettlp_hdr nh;
  ushort local_b0;
  ushort uStack_ae;
  undefined4 uStack_ac;
  ulong local_a8;
  undefined4 local_9c;
  iovec local_98;
  ushort *local_88;
  long local_80;
  ulong *local_78;
  long local_70;
  undefined4 *local_68;
  long local_60;
  void *local_58;
  size_t local_50;
  undefined4 *local_48;
  long local_40;
  undefined4 local_30;
  undefined2 local_2c;
  
  local_68 = &local_9c;
  local_9c = 0;
  local_98.iov_base = &local_30;
  local_30 = 0;
  local_2c = 0;
  local_88 = &local_b0;
  local_98.iov_len = 6;
  local_80 = 8;
  local_60 = 0;
  local_40 = 0;
  uVar2 = (uint)addr;
  if (addr < 0xffffffff) {
    uVar6 = (ulong)(uVar2 & 0xfffffffc);
    local_a8 = CONCAT44(local_a8._4_4_,
                        uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                        (uVar2 & 0xfffffffc) << 0x18);
    local_70 = 4;
    bVar7 = 0x40;
  }
  else {
    uVar6 = addr & 0xfffffffffffffffc;
    local_a8 = addr >> 0x38 | (addr & 0xff000000000000) >> 0x28 | (addr & 0xff0000000000) >> 0x18 |
               (addr & 0xff00000000) >> 8 | (addr & 0xff000000) << 8 | (addr & 0xff0000) << 0x18 |
               (addr & 0xff00) << 0x28 | uVar6 << 0x38;
    local_70 = 8;
    bVar7 = 0x60;
  }
  local_78 = &local_a8;
  uVar1 = count + addr;
  bVar12 = (uVar1 & 3) != 0;
  uVar10 = (count - 4) + addr;
  if (bVar12) {
    uVar10 = uVar1 & 0xfffffffffffffffc;
  }
  if (uVar10 <= uVar6) {
    uVar10 = addr + 4;
  }
  bVar11 = ~(byte)(0xf << ((char)uVar1 - (char)uVar10 & 0x1fU)) & 0xf;
  if (uVar1 < uVar10) {
    bVar11 = 0;
  }
  uVar9 = ~(0xf << ((byte)count & 0x1f)) & 7;
  if (3 < count) {
    uVar9 = 0xf;
  }
  uVar9 = uVar9 << ((byte)addr & 3);
  uVar8 = (ushort)bVar12 + (short)((int)uVar1 - (uVar2 & 0x3fffc) >> 2);
  _local_b0 = CONCAT44(CONCAT13(bVar11 << 4 | (byte)uVar9 & 0xf,
                                CONCAT12(nt->tag,nt->requester << 8 | nt->requester >> 8)),
                       CONCAT22(uVar8 * 0x100 | uVar8 >> 8,(ushort)bVar7));
  if (((uVar9 & 0xf) != 0) && ((uVar9 & 0xf) != 0xf)) {
    uVar2 = 0;
    local_60 = 0;
    do {
      local_60 = (local_60 + 1) - (ulong)(((uVar9 & 0xf) >> (uVar2 & 0x1f) & 1) != 0);
      uVar2 = uVar2 + 1;
    } while (uVar2 != 3);
  }
  if ((bVar11 != 0) && (bVar11 != 0xf)) {
    iVar4 = 0;
    local_40 = 0;
    do {
      local_40 = local_40 + (ulong)(((uint)bVar11 << ((byte)iVar4 & 0x1f) & 8) == 0);
      iVar4 = iVar4 + 1;
    } while (iVar4 != 3);
  }
  local_58 = buf;
  local_50 = count;
  local_48 = local_68;
  sVar3 = writev(nt->sockfd,&local_98,6);
  uVar2 = (uint)sVar3;
  if ((int)uVar2 < 0) {
    lVar5 = (long)(int)uVar2;
  }
  else {
    uVar6 = local_80 + local_98.iov_len + local_70;
    lVar5 = -2;
    if (uVar6 <= (uVar2 & 0x7fffffff)) {
      lVar5 = (ulong)(uVar2 & 0x7fffffff) - (uVar6 + local_60 + local_40);
    }
  }
  return lVar5;
}

Assistant:

ssize_t dma_write(struct nettlp *nt, uintptr_t addr, void *buf, size_t count)
{
	int ret, n;
	char pad[4] = { 0, 0, 0, 0 };
	struct iovec iov[6];
	struct nettlp_hdr nh;
	struct tlp_mr_hdr mh;
	uint64_t dst_addr64;
	uint32_t dst_addr32;

	memset(&nh, 0, sizeof(nh));
	memset(&mh, 0, sizeof(mh));

	iov[0].iov_base = &nh;
	iov[0].iov_len = sizeof(nh);
	iov[1].iov_base = &mh;
	iov[1].iov_len = sizeof(mh);
	iov[3].iov_base = pad;
	iov[3].iov_len = 0;	/* if needed, increment for padding */
	iov[4].iov_base = buf;
	iov[4].iov_len = count;
	iov[5].iov_base = pad;
	iov[5].iov_len = 0;	/* if needed, increment for padding */


	/* build memory write request */
	tlp_set_type(mh.tlp.fmt_type, TLP_TYPE_MWr);
	if (addr < UINT32_MAX) {
		tlp_set_fmt(mh.tlp.fmt_type, TLP_FMT_3DW, TLP_FMT_W_DATA);
		dst_addr32 = htobe32(addr & 0xFFFFFFFC);
		iov[2].iov_base = &dst_addr32;
		iov[2].iov_len = sizeof(dst_addr32);
	} else {
		tlp_set_fmt(mh.tlp.fmt_type, TLP_FMT_4DW, TLP_FMT_W_DATA);
		dst_addr64 = htobe64(addr & 0xFFFFFFFFFFFFFFFC);
		iov[2].iov_base = &dst_addr64;
		iov[2].iov_len = sizeof(dst_addr64);
	}
	mh.requester = ntohs(nt->requester);
	mh.tag = nt->tag;
	mh.lstdw = tlp_calculate_lstdw(addr, count);
	mh.fstdw = tlp_calculate_fstdw(addr, count);
	tlp_set_length(mh.tlp.falen, tlp_calculate_length(addr, count));

	/* XXX:
	 * 
	 * 1st DW BE is used and not 0xF, move the buffer, if 1st DW
	 * is xx10, x100, or 1000. It needs padding.
	 */
	if (mh.fstdw && mh.fstdw != 0xF) {
		for (n = 0; n < 3; n++) {
			if ((mh.fstdw & (0x1 << n)) == 0) {
				/* this byte is not used. padding! */
				iov[3].iov_len++;
			}
		}
	}

	if (mh.lstdw && mh.lstdw != 0xF) {
		for (n = 0; n < 3; n++) {
			if ((mh.lstdw & (0x8 >> n)) == 0) {
				/* this byte is not used, padding! */
				iov[5].iov_len++;
			}
		}
	}


	ret = writev(nt->sockfd, iov, 6);
	if (ret < 0)
		return ret;

	if (ret < (iov[0].iov_len + iov[1].iov_len + iov[2].iov_len)) {
		/* failed to write the whole packet */
		return -2;
	}

	return ret - (iov[0].iov_len + iov[1].iov_len + iov[2].iov_len
		      + iov[3].iov_len + iov[5].iov_len);
}